

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_heap_scatter.cpp
# Opt level: O3

void duckdb::HeapScatterListVector
               (Vector *v,idx_t vcount,SelectionVector *sel,idx_t ser_count,
               data_ptr_t *key_locations,optional_ptr<duckdb::NestedValidity,_true> parent_validity,
               idx_t offset)

{
  VectorType VVar1;
  PhysicalType type;
  long lVar2;
  bool bVar3;
  VectorBuffer *pVVar4;
  Vector *pVVar5;
  idx_t iVar6;
  LogicalType *pLVar7;
  ulong uVar8;
  idx_t iVar9;
  SelectionVector *pSVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  data_ptr_t pdVar14;
  ulong uVar15;
  idx_t iVar16;
  data_ptr_t pdVar17;
  ulong uVar18;
  long lVar19;
  idx_t vcount_00;
  byte *pbVar20;
  ulong uVar21;
  UnifiedVectorFormat list_vdata;
  UnifiedVectorFormat vdata;
  data_ptr_t list_entry_locations [2048];
  idx_t list_entry_sizes [2048];
  optional_ptr<duckdb::NestedValidity,_true> local_80f8;
  ulong local_80f0;
  data_ptr_t local_80e8;
  SelectionVector *local_80e0;
  Vector *local_80d8;
  ulong local_80d0;
  UnifiedVectorFormat local_80c8;
  UnifiedVectorFormat local_8080;
  data_ptr_t local_8038 [2048];
  idx_t local_4038 [2049];
  
  local_80f8.ptr = parent_validity.ptr;
  local_80f0 = ser_count;
  local_80e0 = sel;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_8080);
  Vector::ToUnifiedFormat(v,vcount,&local_8080);
  VVar1 = v->vector_type;
  pVVar5 = v;
  while (VVar1 == DICTIONARY_VECTOR) {
    DictionaryVector::VerifyDictionary(pVVar5);
    pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar5->auxiliary);
    pVVar5 = (Vector *)(pVVar4 + 1);
    VVar1 = *(VectorType *)&pVVar4[1]._vptr_VectorBuffer;
  }
  local_80e8 = pVVar5->data;
  pVVar5 = ListVector::GetEntry(v);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_80c8);
  iVar6 = ListVector::GetListSize(v);
  Vector::ToUnifiedFormat(pVVar5,iVar6,&local_80c8);
  local_80d8 = v;
  pLVar7 = ListType::GetChildType(&v->type);
  if (local_80f0 != 0) {
    uVar21 = 0;
    type = pLVar7->physical_type_;
    do {
      uVar8 = uVar21;
      if (local_80e0->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)local_80e0->sel_vector[uVar21];
      }
      uVar8 = uVar8 + offset;
      if ((local_8080.sel)->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)(local_8080.sel)->sel_vector[uVar8];
      }
      if ((local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6]
           >> (uVar8 & 0x3f) & 1) != 0)) {
        iVar6 = *(idx_t *)(local_80e8 + uVar8 * 0x10);
        uVar8 = *(ulong *)(local_80e8 + uVar8 * 0x10 + 8);
        *(ulong *)key_locations[uVar21] = uVar8;
        pbVar20 = key_locations[uVar21] + 8;
        key_locations[uVar21] = pbVar20;
        uVar18 = uVar8 + 7 >> 3;
        switchD_010444a0::default(pbVar20,0xff,uVar18);
        key_locations[uVar21] = key_locations[uVar21] + uVar18;
        bVar3 = TypeIsConstantSize(type);
        if (bVar3) {
          pdVar17 = (data_ptr_t)0x0;
        }
        else {
          pdVar17 = key_locations[uVar21];
          key_locations[uVar21] = pdVar17 + uVar8 * 8;
        }
        if (uVar8 != 0) {
          lVar19 = 0;
          do {
            uVar18 = iVar6;
            uVar15 = 0x800;
            vcount_00 = 0x800;
            if (uVar8 < 0x800) {
              uVar15 = uVar8;
              vcount_00 = uVar8;
            }
            do {
              uVar12 = uVar18;
              if ((local_80c8.sel)->sel_vector != (sel_t *)0x0) {
                uVar12 = (ulong)(local_80c8.sel)->sel_vector[uVar18];
              }
              if ((local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                   (unsigned_long *)0x0) &&
                 ((local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                   [uVar12 >> 6] >> (uVar12 & 0x3f) & 1) == 0)) {
                *pbVar20 = *pbVar20 & ~(byte)(1L << ((byte)lVar19 & 0x3f));
              }
              lVar13 = lVar19 + 1;
              lVar19 = 0;
              if (lVar13 != 8) {
                lVar19 = lVar13;
              }
              pbVar20 = pbVar20 + (lVar13 == 8);
              uVar15 = uVar15 - 1;
              uVar18 = uVar18 + 1;
            } while (uVar15 != 0);
            local_80d0 = uVar8;
            bVar3 = TypeIsConstantSize(type);
            if (bVar3) {
              iVar9 = GetTypeIdSize(type);
              pdVar14 = key_locations[uVar21];
              iVar16 = 0;
              do {
                local_8038[iVar16] = pdVar14;
                pdVar14 = pdVar14 + iVar9;
                iVar16 = iVar16 + 1;
              } while (vcount_00 != iVar16);
              key_locations[uVar21] = pdVar14;
            }
            else {
              switchD_010444a0::default(local_4038,0,vcount_00 * 8);
              pSVar10 = FlatVector::IncrementalSelectionVector();
              RowOperations::ComputeEntrySizes(pVVar5,local_4038,vcount_00,vcount_00,pSVar10,iVar6);
              lVar13 = 0;
              do {
                pdVar14 = key_locations[uVar21];
                *(data_ptr_t *)((long)local_8038 + lVar13) = pdVar14;
                lVar2 = *(long *)((long)local_4038 + lVar13);
                key_locations[uVar21] = pdVar14 + lVar2;
                *(long *)(pdVar17 + lVar13) = lVar2;
                lVar13 = lVar13 + 8;
              } while (vcount_00 * 8 - lVar13 != 0);
              pdVar17 = pdVar17 + lVar13;
            }
            iVar9 = ListVector::GetListSize(local_80d8);
            pSVar10 = FlatVector::IncrementalSelectionVector();
            RowOperations::HeapScatter
                      (pVVar5,iVar9,pSVar10,vcount_00,local_8038,
                       (optional_ptr<duckdb::NestedValidity,_true>)0x0,iVar6);
            iVar6 = iVar6 + vcount_00;
            uVar8 = local_80d0 - vcount_00;
          } while (uVar8 != 0);
        }
      }
      else if (local_80f8.ptr != (NestedValidity *)0x0) {
        optional_ptr<duckdb::NestedValidity,_true>::CheckValid(&local_80f8);
        if ((local_80f8.ptr)->list_validity_location == (data_ptr_t)0x0) {
          bVar11 = (byte)(local_80f8.ptr)->idx_in_entry;
          pbVar20 = (local_80f8.ptr)->struct_validity_locations[uVar21] +
                    (local_80f8.ptr)->entry_idx;
        }
        else {
          uVar8 = (local_80f8.ptr)->list_validity_offset + uVar21;
          bVar11 = (byte)uVar8 & 7;
          pbVar20 = (local_80f8.ptr)->list_validity_location + (uVar8 >> 3);
        }
        *pbVar20 = *pbVar20 & ~(byte)(1L << (bVar11 & 0x3f));
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != local_80f0);
  }
  if (local_80c8.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80c8.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80c8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8080.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8080.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8080.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HeapScatterListVector(Vector &v, idx_t vcount, const SelectionVector &sel, idx_t ser_count,
                                  data_ptr_t *key_locations, optional_ptr<NestedValidity> parent_validity,
                                  idx_t offset) {
	UnifiedVectorFormat vdata;
	v.ToUnifiedFormat(vcount, vdata);

	auto list_data = ListVector::GetData(v);
	auto &child_vector = ListVector::GetEntry(v);

	UnifiedVectorFormat list_vdata;
	child_vector.ToUnifiedFormat(ListVector::GetListSize(v), list_vdata);
	auto child_type = ListType::GetChildType(v.GetType()).InternalType();

	idx_t list_entry_sizes[STANDARD_VECTOR_SIZE];
	data_ptr_t list_entry_locations[STANDARD_VECTOR_SIZE];

	for (idx_t i = 0; i < ser_count; i++) {
		auto idx = sel.get_index(i);
		auto source_idx = vdata.sel->get_index(idx + offset);
		if (!vdata.validity.RowIsValid(source_idx)) {
			if (parent_validity) {
				// set the row validitymask for this column to invalid
				parent_validity->SetInvalid(i);
			}
			continue;
		}
		auto list_entry = list_data[source_idx];

		// store list length
		Store<uint64_t>(list_entry.length, key_locations[i]);
		key_locations[i] += sizeof(list_entry.length);

		// make room for the validitymask
		data_ptr_t list_validitymask_location = key_locations[i];
		idx_t entry_offset_in_byte = 0;
		idx_t validitymask_size = (list_entry.length + 7) / 8;
		memset(list_validitymask_location, -1, validitymask_size);
		key_locations[i] += validitymask_size;

		// serialize size of each entry (if non-constant size)
		data_ptr_t var_entry_size_ptr = nullptr;
		if (!TypeIsConstantSize(child_type)) {
			var_entry_size_ptr = key_locations[i];
			key_locations[i] += list_entry.length * sizeof(idx_t);
		}

		auto entry_remaining = list_entry.length;
		auto entry_offset = list_entry.offset;
		while (entry_remaining > 0) {
			// the list entry can span multiple vectors
			auto next = MinValue((idx_t)STANDARD_VECTOR_SIZE, entry_remaining);

			// serialize list validity
			for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
				auto list_idx = list_vdata.sel->get_index(entry_idx + entry_offset);
				if (!list_vdata.validity.RowIsValid(list_idx)) {
					*(list_validitymask_location) &= ~(1UL << entry_offset_in_byte);
				}
				if (++entry_offset_in_byte == 8) {
					list_validitymask_location++;
					entry_offset_in_byte = 0;
				}
			}

			if (TypeIsConstantSize(child_type)) {
				// constant size list entries: set list entry locations
				const idx_t type_size = GetTypeIdSize(child_type);
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += type_size;
				}
			} else {
				// variable size list entries: compute entry sizes and set list entry locations
				std::fill_n(list_entry_sizes, next, 0);
				RowOperations::ComputeEntrySizes(child_vector, list_entry_sizes, next, next,
				                                 *FlatVector::IncrementalSelectionVector(), entry_offset);
				for (idx_t entry_idx = 0; entry_idx < next; entry_idx++) {
					list_entry_locations[entry_idx] = key_locations[i];
					key_locations[i] += list_entry_sizes[entry_idx];
					Store<idx_t>(list_entry_sizes[entry_idx], var_entry_size_ptr);
					var_entry_size_ptr += sizeof(idx_t);
				}
			}

			// now serialize to the locations
			RowOperations::HeapScatter(child_vector, ListVector::GetListSize(v),
			                           *FlatVector::IncrementalSelectionVector(), next, list_entry_locations, nullptr,
			                           entry_offset);

			// update for next iteration
			entry_remaining -= next;
			entry_offset += next;
		}
	}
}